

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O1

void __thiscall Gym_Emu::parse_frame(Gym_Emu *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  byte *pbVar7;
  
  pbVar4 = this->pos;
  if ((this->loop_remain != 0) &&
     (iVar3 = this->loop_remain + -1, this->loop_remain = iVar3, iVar3 == 0)) {
    this->loop_begin = pbVar4;
  }
  pbVar5 = pbVar4 + 1;
  bVar6 = *pbVar4;
  if (bVar6 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      bVar1 = pbVar4[1];
      if (bVar6 == '\x03') {
        Sms_Apu::write_data(&this->apu,0,(uint)bVar1);
        pbVar7 = pbVar4 + 2;
      }
      else if (bVar6 == '\x02') {
        Ym2612_Emu::write1(&this->fm,(uint)bVar1,(uint)pbVar4[2]);
        pbVar7 = pbVar4 + 3;
      }
      else {
        pbVar7 = pbVar5;
        if (bVar6 == '\x01') {
          bVar2 = pbVar4[2];
          pbVar7 = pbVar4 + 3;
          if (bVar1 == 0x2a) {
            if (iVar3 < 0x400) {
              this->dac_buf[iVar3] = bVar2;
              iVar3 = iVar3 + (uint)this->dac_enabled;
            }
          }
          else {
            if (bVar1 == 0x2b) {
              this->dac_enabled = (bool)(bVar2 >> 7);
            }
            Ym2612_Emu::write0(&this->fm,(uint)bVar1,(uint)bVar2);
          }
        }
      }
      pbVar5 = pbVar7 + 1;
      bVar6 = *pbVar7;
      pbVar4 = pbVar7;
    } while (bVar6 != '\0');
  }
  pbVar4 = pbVar5;
  if ((this->data_end <= pbVar5) && (pbVar4 = this->loop_begin, this->loop_begin == (byte *)0x0)) {
    (this->super_Music_Emu).emu_track_ended_ = true;
    pbVar4 = pbVar5;
  }
  this->pos = pbVar4;
  if ((iVar3 != 0) && (this->dac_muted == false)) {
    run_dac(this,iVar3);
  }
  this->prev_dac_count = iVar3;
  return;
}

Assistant:

void Gym_Emu::parse_frame()
{
	int dac_count = 0;
	const byte* pos = this->pos;
	
	if ( loop_remain && !--loop_remain )
		loop_begin = pos; // find loop on first time through sequence
	
	int cmd;
	while ( (cmd = *pos++) != 0 )
	{
		int data = *pos++;
		if ( cmd == 1 )
		{
			int data2 = *pos++;
			if ( data != 0x2A )
			{
				if ( data == 0x2B )
					dac_enabled = (data2 & 0x80) != 0;
				
				fm.write0( data, data2 );
			}
			else if ( dac_count < (int) sizeof dac_buf )
			{
				dac_buf [dac_count] = data2;
				dac_count += dac_enabled;
			}
		}
		else if ( cmd == 2 )
		{
			fm.write1( data, *pos++ );
		}
		else if ( cmd == 3 )
		{
			apu.write_data( 0, data );
		}
		else
		{
			// to do: many GYM streams are full of errors, and error count should
			// reflect cases where music is really having problems
			//log_error(); 
			--pos; // put data back
		}
	}
	
	// loop
	if ( pos >= data_end )
	{
		check( pos == data_end );
		
		if ( loop_begin )
			pos = loop_begin;
		else
			set_track_ended();
	}
	this->pos = pos;
	
	// dac
	if ( dac_count && !dac_muted )
		run_dac( dac_count );
	prev_dac_count = dac_count;
}